

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiDockNode::~ImGuiDockNode(ImGuiDockNode *this)

{
  ImVector<ImGuiWindow_*> *in_RDI;
  
  IM_DELETE<ImGuiTabBar>((ImGuiTabBar *)0x1c895c);
  in_RDI[3].Data = (ImGuiWindow **)0x0;
  in_RDI[2].Size = 0;
  in_RDI[2].Capacity = 0;
  in_RDI[1].Data = (ImGuiWindow **)0x0;
  ImVector<ImGuiWindow_*>::~ImVector(in_RDI);
  return;
}

Assistant:

ImGuiDockNode::~ImGuiDockNode()
{
    IM_DELETE(TabBar);
    TabBar = NULL;
    ChildNodes[0] = ChildNodes[1] = NULL;
}